

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O0

char * string_from_atom(atom_server as,atom_t atom)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  ssize_t sVar4;
  uint in_ESI;
  long in_RDI;
  char buf [100];
  int numbytes;
  Tcl_HashEntry *entry;
  send_get_atom_msg_ptr stored;
  send_get_atom_msg tmp_rec;
  char local_a8 [4];
  int in_stack_ffffffffffffff5c;
  atom_server in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  atom_server in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff98;
  atom_server in_stack_ffffffffffffffa0;
  char **local_30;
  char *local_28;
  uint local_20;
  uint local_14;
  long local_10;
  char *local_8;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  lVar2 = (**(code **)(in_RDI + 200))(in_RDI + 0x88,(long)(int)in_ESI);
  if (lVar2 == 0) {
    sprintf(local_a8 + 1,"N%d",(ulong)local_14);
    iVar1 = establish_server_connection(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    if (iVar1 == 0) {
      return (char *)0x0;
    }
    sVar3 = strlen(local_a8 + 1);
    local_a8[0] = (char)sVar3;
    sVar4 = write(*(int *)(local_10 + 4),local_a8,(long)(local_a8[0] + 1));
    if (sVar4 != local_a8[0] + 1) {
      perror("write");
      return (char *)0x0;
    }
    set_blocking(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    local_a8[1] = '\0';
    while (local_a8[1] != 'S') {
      sVar4 = read(*(int *)(local_10 + 4),local_a8,1);
      if ((int)sVar4 == -1) {
        perror("read");
        return (char *)0x0;
      }
      sVar4 = read(*(int *)(local_10 + 4),local_a8 + 1,(long)local_a8[0]);
      if ((int)sVar4 != (int)local_a8[0]) {
        perror("read2");
        return (char *)0x0;
      }
      local_a8[(int)sVar4 + 1] = '\0';
      if (local_a8[1] != 'S') {
        handle_unexpected_msg(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
    if (local_a8[2] == '\0') {
      return (char *)0x0;
    }
    local_28 = local_a8 + 2;
    local_20 = local_14;
    enter_atom_into_cache
              (in_stack_ffffffffffffff78,
               (send_get_atom_msg_ptr)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
    ;
    local_30 = &local_28;
  }
  else {
    local_30 = *(char ***)(lVar2 + 0x18);
  }
  if (*local_30 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = strdup(*local_30);
  }
  return local_8;
}

Assistant:

extern
char *
string_from_atom(atom_server as, atom_t atom)
{
    send_get_atom_msg tmp_rec;
    send_get_atom_msg_ptr stored;
    Tcl_HashEntry *entry = NULL;
    int numbytes;
    char buf[MAXDATASIZE];

    entry = Tcl_FindHashEntry(&as->value_hash_table, (char *) (int64_t) atom);

    if (entry == NULL) {
	sprintf(&buf[1], "N%d", atom);
	if (establish_server_connection(as, 1) == 0) return NULL;
	buf[0] = (char) strlen(&buf[1]);
	if (write(as->tcp_fd, buf, buf[0]+1) != buf[0] + 1) {
	    perror("write");
	    return NULL;
	}
	set_blocking(as, 1);	/* set server fd blocking */
	buf[1] = 0;
	while (buf[1] != 'S') {
	    if ((numbytes = read(as->tcp_fd, buf, 1)) == -1) {
		perror("read");
		return NULL;
	    }
	    if ((numbytes = read(as->tcp_fd, &buf[1], buf[0])) != buf[0]) {
		perror("read2");
		return NULL;
	    }
	    buf[numbytes+1] = 0;
	    if (buf[1] != 'S')
		handle_unexpected_msg(as, &buf[1]);
	}

	if (buf[2] == 0) {
	    return NULL;
	}
	tmp_rec.atom_string = &buf[2];
	tmp_rec.atom = atom;

	(void) enter_atom_into_cache(as, &tmp_rec);
	stored = &tmp_rec;
    } else {
	stored = (send_get_atom_msg_ptr) Tcl_GetHashValue(entry);
    }
    if (stored->atom_string != NULL) {
	return strdup(stored->atom_string);
    } else {
	return NULL;
    }
}